

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall icu_63::VTimeZone::VTimeZone(VTimeZone *this)

{
  VTimeZone *this_local;
  
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__VTimeZone_004ec0d0;
  this->tz = (BasicTimeZone *)0x0;
  this->vtzlines = (UVector *)0x0;
  UnicodeString::UnicodeString(&this->tzurl);
  this->lastmod = 1.838821689216e+17;
  UnicodeString::UnicodeString(&this->olsonzid);
  UnicodeString::UnicodeString(&this->icutzver);
  return;
}

Assistant:

VTimeZone::VTimeZone()
:   BasicTimeZone(), tz(NULL), vtzlines(NULL),
    lastmod(MAX_MILLIS) {
}